

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTPNStmForeachBase::fold_constants(CTPNStmForeachBase *this,CTcPrsSymtab *symtab)

{
  CTcTokenizer *this_00;
  int iVar1;
  CTcTokFileDesc *pCVar2;
  long lVar3;
  undefined4 extraout_var;
  undefined8 in_RSI;
  CTPNStmBase *in_RDI;
  
  this_00 = G_tok;
  pCVar2 = CTPNStmBase::get_source_desc(in_RDI);
  lVar3 = CTPNStmBase::get_source_linenum(in_RDI);
  CTcTokenizer::set_line_info(this_00,pCVar2,lVar3);
  if (in_RDI[1].next_stm_ != (CTPNStm *)0x0) {
    iVar1 = (*((in_RDI[1].next_stm_)->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase[0xf])(in_RDI[1].next_stm_,in_RSI);
    in_RDI[1].next_stm_ = (CTPNStm *)CONCAT44(extraout_var,iVar1);
  }
  if (in_RDI[1].file_ != (CTcTokFileDesc *)0x0) {
    pCVar2 = (CTcTokFileDesc *)
             (**(code **)(*(long *)in_RDI[1].file_ + 0x78))(in_RDI[1].file_,in_RSI);
    in_RDI[1].file_ = pCVar2;
  }
  if (in_RDI[1].linenum_ != 0) {
    lVar3 = (**(code **)(*(long *)in_RDI[1].linenum_ + 0x78))((long *)in_RDI[1].linenum_,in_RSI);
    in_RDI[1].linenum_ = lVar3;
  }
  return &in_RDI->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNStmForeachBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* set our location for any errors that occur */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());

    /* 
     *   fold constants in each of our expressions, replacing the
     *   expressions with the folded versions 
     */
    if (iter_expr_ != 0)
        iter_expr_ = iter_expr_->fold_constants(symtab);
    if (coll_expr_ != 0)
        coll_expr_ = coll_expr_->fold_constants(symtab);

    /* fold constants in the body statement */
    if (body_stm_ != 0)
        body_stm_ = (CTPNStm *)body_stm_->fold_constants(symtab);
    
    /* we are not directly changed by this operation */
    return this;
}